

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(int argc,char **argv)

{
  int arr [5];
  uint local_28;
  uint uStack_24;
  uint uStack_20;
  uint uStack_1c;
  uint local_18;
  
  local_28 = 1;
  uStack_24 = 5;
  uStack_20 = 4;
  uStack_1c = 2;
  local_18 = 4;
  printf("Array is [%d, %d, %d, %d, %d].\n",1,5,4,2,4);
  bubble_sort((int *)&local_28,5);
  printf("The sorted array is [%d, %d, %d, %d, %d].\n",(ulong)local_28,(ulong)uStack_24,
         (ulong)uStack_20,(ulong)uStack_1c,(ulong)local_18);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  int arr[ARR_LEN] = {1, 5, 4, 2, 4};
  printf("Array is [%d, %d, %d, %d, %d].\n", arr[0], arr[1], arr[2], arr[3], arr[4]);

  bubble_sort(arr, ARR_LEN);

  printf("The sorted array is [%d, %d, %d, %d, %d].\n", arr[0], arr[1], arr[2], arr[3], arr[4]);
  return 0;
}